

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::OffsetIndex::OffsetIndex(OffsetIndex *this,OffsetIndex *other172)

{
  long in_RSI;
  TBase *in_RDI;
  vector<duckdb_parquet::PageLocation,_true> *pvVar1;
  vector<duckdb_parquet::PageLocation,_true> *this_00;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__OffsetIndex_00c02320;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__OffsetIndex_00c02320;
  pvVar1 = (vector<duckdb_parquet::PageLocation,_true> *)(in_RDI + 1);
  duckdb::vector<duckdb_parquet::PageLocation,_true>::vector
            ((vector<duckdb_parquet::PageLocation,_true> *)0x7189b0);
  this_00 = (vector<duckdb_parquet::PageLocation,_true> *)(in_RDI + 4);
  duckdb::vector<long,_true>::vector((vector<long,_true> *)0x7189c3);
  _OffsetIndex__isset::_OffsetIndex__isset((_OffsetIndex__isset *)(in_RDI + 7));
  duckdb::vector<duckdb_parquet::PageLocation,_true>::operator=(this_00,pvVar1);
  duckdb::vector<long,_true>::operator=((vector<long,_true> *)this_00,(vector<long,_true> *)pvVar1);
  *(undefined1 *)&in_RDI[7]._vptr_TBase = *(undefined1 *)(in_RSI + 0x38);
  return;
}

Assistant:

OffsetIndex::OffsetIndex(const OffsetIndex& other172) {
  page_locations = other172.page_locations;
  unencoded_byte_array_data_bytes = other172.unencoded_byte_array_data_bytes;
  __isset = other172.__isset;
}